

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::SyncMetaData
          (CWallet *this,
          pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
          range)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  long in_RDI;
  long in_FS_OFFSET;
  CWalletTx *copyTo;
  uint256 *hash;
  CWalletTx *wtx;
  CWalletTx *copyFrom;
  int nMinOrderPos;
  iterator it_1;
  iterator it;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_ffffffffffffff98;
  mapped_type *_tx;
  undefined4 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = std::numeric_limits<int>::max();
  _tx = (mapped_type *)0x0;
  while (bVar2 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                            in_stack_ffffffffffffff98,
                            (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff98 =
         (unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
          *)(in_RDI + 0x248);
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::operator->
              (in_stack_ffffffffffffff88);
    pmVar4 = std::
             unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
             ::at(in_stack_ffffffffffffff98,
                  (key_type *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    if (pmVar4->nOrderPos < (long)iVar3) {
      iVar3 = (int)pmVar4->nOrderPos;
      _tx = pmVar4;
    }
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::operator++
              (in_stack_ffffffffffffff88);
  }
  if (_tx != (mapped_type *)0x0) {
    while (bVar2 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                              in_stack_ffffffffffffff98,
                              (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::operator->
                (in_stack_ffffffffffffff88);
      pmVar4 = std::
               unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
               ::at(in_stack_ffffffffffffff98,
                    (key_type *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      if (_tx != pmVar4) {
        in_stack_ffffffffffffff97 = _tx != (CWalletTx *)0x0;
        if (!(bool)in_stack_ffffffffffffff97) {
          __assert_fail("copyFrom && \"Oldest wallet transaction in range assumed to have been found.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x2e8,
                        "void wallet::CWallet::SyncMetaData(std::pair<TxSpends::iterator, TxSpends::iterator>)"
                       );
        }
        bVar2 = CWalletTx::IsEquivalentTo
                          ((CWalletTx *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),_tx);
        if (bVar2) {
          _GLOBAL__N_1::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffff98,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
          _GLOBAL__N_1::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)hash,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)copyTo);
          pmVar4->nTimeSmart = _tx->nTimeSmart;
          pmVar4->fFromMe = (bool)(_tx->fFromMe & 1);
        }
      }
      std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::operator++
                (in_stack_ffffffffffffff88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SyncMetaData(std::pair<TxSpends::iterator, TxSpends::iterator> range)
{
    // We want all the wallet transactions in range to have the same metadata as
    // the oldest (smallest nOrderPos).
    // So: find smallest nOrderPos:

    int nMinOrderPos = std::numeric_limits<int>::max();
    const CWalletTx* copyFrom = nullptr;
    for (TxSpends::iterator it = range.first; it != range.second; ++it) {
        const CWalletTx* wtx = &mapWallet.at(it->second);
        if (wtx->nOrderPos < nMinOrderPos) {
            nMinOrderPos = wtx->nOrderPos;
            copyFrom = wtx;
        }
    }

    if (!copyFrom) {
        return;
    }

    // Now copy data from copyFrom to rest:
    for (TxSpends::iterator it = range.first; it != range.second; ++it)
    {
        const uint256& hash = it->second;
        CWalletTx* copyTo = &mapWallet.at(hash);
        if (copyFrom == copyTo) continue;
        assert(copyFrom && "Oldest wallet transaction in range assumed to have been found.");
        if (!copyFrom->IsEquivalentTo(*copyTo)) continue;
        copyTo->mapValue = copyFrom->mapValue;
        copyTo->vOrderForm = copyFrom->vOrderForm;
        // fTimeReceivedIsTxTime not copied on purpose
        // nTimeReceived not copied on purpose
        copyTo->nTimeSmart = copyFrom->nTimeSmart;
        copyTo->fFromMe = copyFrom->fFromMe;
        // nOrderPos not copied on purpose
        // cached members not copied on purpose
    }
}